

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::printTo(ColumnCryptoMetaData *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  EncryptionWithColumnKey *in_stack_00000108;
  string local_68 [55];
  byte local_31;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"ColumnCryptoMetaData(");
  std::operator<<(local_10,"ENCRYPTION_WITH_FOOTER_KEY=");
  poVar1 = local_10;
  local_31 = 0;
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithFooterKey>
              ((EncryptionWithFooterKey *)in_stack_00000108);
    local_31 = 1;
    std::operator<<(poVar1,local_30);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"ENCRYPTION_WITH_COLUMN_KEY=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x58) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionWithColumnKey>(in_stack_00000108);
    std::operator<<(poVar1,local_68);
    std::__cxx11::string::~string(local_68);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void ColumnCryptoMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnCryptoMetaData(";
  out << "ENCRYPTION_WITH_FOOTER_KEY="; (__isset.ENCRYPTION_WITH_FOOTER_KEY ? (out << to_string(ENCRYPTION_WITH_FOOTER_KEY)) : (out << "<null>"));
  out << ", " << "ENCRYPTION_WITH_COLUMN_KEY="; (__isset.ENCRYPTION_WITH_COLUMN_KEY ? (out << to_string(ENCRYPTION_WITH_COLUMN_KEY)) : (out << "<null>"));
  out << ")";
}